

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

StatusOr<absl::lts_20240722::Span<char>_> * __thiscall
google::protobuf::json_internal::anon_unknown_5::DecodeBase64InPlace
          (StatusOr<absl::lts_20240722::Span<char>_> *__return_storage_ptr__,anon_unknown_5 *this,
          Span<char> base64)

{
  ulong in_RAX;
  anon_unknown_5 *paVar1;
  anon_unknown_5 *paVar2;
  uint uVar3;
  anon_unknown_5 *paVar4;
  anon_unknown_5 *paVar5;
  Status local_28;
  
  paVar4 = this + (long)base64.ptr_;
  paVar1 = this;
  paVar2 = this;
  if (((undefined1  [16])base64 & (undefined1  [16])0xfffffffc) != (undefined1  [16])0x0) {
    paVar5 = this + 4;
    do {
      uVar3 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[3]] |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[2]] << 6 |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
      if ((int)uVar3 < 0) {
        if (paVar2[3] == (anon_unknown_5)0x3d && paVar4 == paVar5) {
          if (paVar2[2] == (anon_unknown_5)0x3d) {
            paVar4 = paVar4 + -2;
          }
          else {
            paVar4 = paVar4 + -1;
          }
        }
      }
      else {
        *paVar1 = SUB41(uVar3 >> 0x10,0);
        paVar1[1] = SUB41(uVar3 >> 8,0);
        paVar1[2] = SUB41(uVar3,0);
      }
      if ((int)uVar3 < 0) break;
      paVar2 = paVar2 + 4;
      paVar1 = paVar1 + 3;
      paVar5 = paVar5 + 4;
    } while (paVar2 < this + ((uint)base64.ptr_ & 0xfffffffc));
  }
  if (paVar2 < paVar4) {
    if ((long)paVar4 - (long)paVar2 == 3) {
      uVar3 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[2]] << 6 |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
      *paVar1 = SUB41(uVar3 >> 0x10,0);
      paVar1[1] = SUB41(uVar3 >> 8,0);
      paVar1 = paVar1 + 2;
    }
    else {
      uVar3 = 0xffffffff;
      if ((long)paVar4 - (long)paVar2 == 2) {
        uVar3 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
                (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
        *paVar1 = SUB41(uVar3 >> 0x10,0);
        paVar1 = paVar1 + 1;
      }
    }
    if ((int)uVar3 < 0) {
      local_28.rep_ = in_RAX;
      absl::lts_20240722::InvalidArgumentError(&local_28,0xe,"corrupt base64");
      absl::lts_20240722::internal_statusor::StatusOrData<absl::lts_20240722::Span<char>_>::
      StatusOrData<absl::lts_20240722::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>,
                 &local_28);
      if ((local_28.rep_ & 1) != 0) {
        return __return_storage_ptr__;
      }
      absl::lts_20240722::status_internal::StatusRep::Unref();
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.ptr_ =
       (pointer)this;
  (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.len_ =
       (long)paVar1 - (long)this;
  (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<absl::lts_20240722::Span<char>_>_1)0x1;
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<absl::Span<char>> DecodeBase64InPlace(absl::Span<char> base64) {
  // We decode in place. This is safe because this is a new buffer (not
  // aliasing the input) and because base64 decoding shrinks 4 bytes into 3.
  char* out = base64.data();
  const char* ptr = base64.data();
  const char* end = ptr + base64.size();
  const char* end4 = ptr + (base64.size() & ~3u);

  for (; ptr < end4; ptr += 4, out += 3) {
    auto val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
               Base64Lookup(ptr[2]) << 6 | Base64Lookup(ptr[3]) << 0;

    if (static_cast<int32_t>(val) < 0) {
      // Junk chars or padding. Remove trailing padding, if any.
      if (end - ptr == 4 && ptr[3] == '=') {
        if (ptr[2] == '=') {
          end -= 2;
        } else {
          end -= 1;
        }
      }
      break;
    }

    out[0] = val >> 16;
    out[1] = (val >> 8) & 0xff;
    out[2] = val & 0xff;
  }

  if (ptr < end) {
    uint32_t val = ~0u;
    switch (end - ptr) {
      case 2:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12;
        out[0] = val >> 16;
        out += 1;
        break;
      case 3:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
              Base64Lookup(ptr[2]) << 6;
        out[0] = val >> 16;
        out[1] = (val >> 8) & 0xff;
        out += 2;
        break;
    }

    if (static_cast<int32_t>(val) < 0) {
      return absl::InvalidArgumentError("corrupt base64");
    }
  }

  return absl::Span<char>(base64.data(),
                          static_cast<size_t>(out - base64.data()));
}